

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpPackedVarint<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint *puVar4;
  char *pcVar5;
  Nonnull<const_char_*> failure_msg;
  uint uVar6;
  ulong uVar7;
  LogMessageFatal local_40;
  
  uVar7 = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((uVar7 & 3) != 0) {
    AlignFail();
  }
  if ((data.field_0._0_4_ & 7) != 2) {
    pcVar5 = MpRepeatedVarint<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  uVar1 = *(ushort *)(uVar7 + 10);
  if ((ulong)table->has_bits_offset != 0) {
    puVar4 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar4 & 3) != 0) {
      AlignFail(puVar4);
    }
    *puVar4 = *puVar4 | (uint)hasbits;
  }
  uVar2 = uVar1 >> 6;
  uVar3 = uVar2 & 7;
  if ((uVar2 & 7) == 0) {
    pcVar5 = MpPackedVarintT<false,bool,(unsigned_short)0>(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  uVar6 = uVar1 & 0x600;
  if (uVar3 == 2) {
    switch(uVar6) {
    default:
      pcVar5 = MpPackedVarintT<false,unsigned_int,(unsigned_short)0>(msg,ptr,ctx,data,table,hasbits)
      ;
      return pcVar5;
    case 0x200:
    case 0x220:
    case 0x240:
    case 0x260:
    case 0x280:
    case 0x2a0:
    case 0x2c0:
    case 0x2e0:
    case 0x300:
    case 800:
    case 0x340:
    case 0x360:
    case 0x380:
    case 0x3a0:
    case 0x3c0:
    case 0x3e0:
      pcVar5 = MpPackedVarintT<false,unsigned_int,(unsigned_short)512>
                         (msg,ptr,ctx,data,table,hasbits);
      return pcVar5;
    case 0x400:
    case 0x420:
    case 0x440:
    case 0x460:
    case 0x480:
    case 0x4a0:
    case 0x4c0:
    case 0x4e0:
    case 0x500:
    case 0x520:
    case 0x540:
    case 0x560:
    case 0x580:
    case 0x5a0:
    case 0x5c0:
    case 0x5e0:
      pcVar5 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                         (msg,ptr,ctx,data,table,hasbits);
      return pcVar5;
    case 0x600:
    case 0x620:
    case 0x640:
    case 0x660:
    case 0x680:
    case 0x6a0:
    case 0x6c0:
    case 0x6e0:
    case 0x700:
    case 0x720:
    case 0x740:
    case 0x760:
    case 0x780:
    case 0x7a0:
    case 0x7c0:
    case 0x7e0:
      pcVar5 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1536>
                         (msg,ptr,ctx,data,table,hasbits);
      return pcVar5;
    }
  }
  if (uVar3 != 3) {
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0x8f9);
  }
  if ((short)uVar6 == 0) {
    pcVar5 = MpPackedVarintT<false,unsigned_long,(unsigned_short)0>(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  if (uVar6 == 0x200) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar6,0x200,"xform_val == +field_layout::kTvZigZag");
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    pcVar5 = MpPackedVarintT<false,unsigned_long,(unsigned_short)512>
                       (msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
             ,0x8db,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpPackedVarint(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const auto type_card = entry.type_card;
  const auto decoded_wiretype = data.tag() & 7;

  // Check for non-packed repeated fallback:
  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpRepeatedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  // For split we avoid the duplicate code and have the impl reload the value.
  // Less code bloat for uncommon paths.
  const uint16_t xform_val = (type_card & field_layout::kTvMask);

  // Since ctx->ReadPackedFixed does not use TailCall<> or Return<>, sync any
  // pending hasbits now:
  SyncHasbits(msg, hasbits, table);

  const uint16_t rep = type_card & field_layout::kRepMask;

  switch (rep >> field_layout::kRepShift) {
    case field_layout::kRep64Bits >> field_layout::kRepShift:
      if (xform_val == 0) {
        PROTOBUF_MUSTTAIL return MpPackedVarintT<is_split, uint64_t, 0>(
            PROTOBUF_TC_PARAM_PASS);
      } else {
        ABSL_DCHECK_EQ(xform_val, +field_layout::kTvZigZag);
        PROTOBUF_MUSTTAIL return MpPackedVarintT<
            is_split, uint64_t, (is_split ? 0 : field_layout::kTvZigZag)>(
            PROTOBUF_TC_PARAM_PASS);
      }
    case field_layout::kRep32Bits >> field_layout::kRepShift:
      switch (xform_val >> field_layout::kTvShift) {
        case 0:
          PROTOBUF_MUSTTAIL return MpPackedVarintT<is_split, uint32_t, 0>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvZigZag >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpPackedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvZigZag)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvEnum >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpPackedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvEnum)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvRange >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpPackedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvRange)>(
              PROTOBUF_TC_PARAM_PASS);
        default:
          Unreachable();
      }
    case field_layout::kRep8Bits >> field_layout::kRepShift:
      PROTOBUF_MUSTTAIL return MpPackedVarintT<is_split, bool, 0>(
          PROTOBUF_TC_PARAM_PASS);

    default:
      Unreachable();
      return nullptr;  // To silence -Werror=return-type in some toolchains
  }
}